

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O2

ButtonRole __thiscall QDialogButtonBox::buttonRole(QDialogButtonBox *this,QAbstractButton *button)

{
  long lVar1;
  long lVar2;
  int i;
  ButtonRole BVar3;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  ButtonRole local_14;
  QAbstractButton *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  for (uVar4 = 0; local_10 = button, uVar4 != 9; uVar4 = uVar4 + 1) {
    lVar5 = 0;
    while (*(long *)(lVar2 + 0x268 + uVar4 * 0x18) != lVar5) {
      lVar1 = lVar5 * 8;
      lVar5 = lVar5 + 1;
      if (*(QAbstractButton **)(*(long *)(lVar2 + uVar4 * 0x18 + 0x260) + lVar1) == button)
      goto LAB_00435162;
    }
  }
  local_14 = InvalidRole;
  BVar3 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
          ::value((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                   *)(lVar2 + 0x3c0),&local_10,&local_14);
  uVar4 = (ulong)(uint)BVar3;
LAB_00435162:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (ButtonRole)uVar4;
}

Assistant:

QDialogButtonBox::ButtonRole QDialogButtonBox::buttonRole(QAbstractButton *button) const
{
    Q_D(const QDialogButtonBox);
    for (int i = 0; i < NRoles; ++i) {
        const QList<QAbstractButton *> &list = d->buttonLists[i];
        for (int j = 0; j < list.size(); ++j) {
            if (list.at(j) == button)
                return ButtonRole(i);
        }
    }
    return d->hiddenButtons.value(button, InvalidRole);
}